

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O0

void prometheus::anon_unknown_5::WriteValue(ostream *out,string *value)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  ostream *poVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *value_local;
  ostream *out_local;
  
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar1 = *pcVar3;
    if (cVar1 == '\n') {
      poVar4 = std::operator<<(out,'\\');
      std::operator<<(poVar4,'n');
    }
    else if (cVar1 == '\"') {
      poVar4 = std::operator<<(out,'\\');
      std::operator<<(poVar4,'\"');
    }
    else if (cVar1 == '\\') {
      poVar4 = std::operator<<(out,'\\');
      std::operator<<(poVar4,'\\');
    }
    else {
      std::operator<<(out,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void WriteValue(std::ostream& out, const std::string& value) {
  for (auto c : value) {
    switch (c) {
      case '\n':
        out << '\\' << 'n';
        break;

      case '\\':
        out << '\\' << c;
        break;

      case '"':
        out << '\\' << c;
        break;

      default:
        out << c;
        break;
    }
  }
}